

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

UBool isAliasInList(char *alias,uint32_t listOffset)

{
  ushort uVar1;
  uint16_t *puVar2;
  int iVar3;
  uint16_t *currList;
  uint local_20;
  uint32_t listCount;
  uint32_t currAlias;
  uint32_t listOffset_local;
  char *alias_local;
  
  puVar2 = gMainTable.taggedAliasLists;
  if (listOffset != 0) {
    uVar1 = gMainTable.taggedAliasLists[listOffset];
    for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
      if ((puVar2[(ulong)listOffset + (ulong)local_20 + 1] != 0) &&
         (iVar3 = ucnv_compareNames_63
                            (alias,(char *)(gMainTable.stringTable +
                                           (int)(uint)puVar2[(ulong)listOffset + (ulong)local_20 + 1
                                                            ])), iVar3 == 0)) {
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

static inline UBool
isAliasInList(const char *alias, uint32_t listOffset) {
    if (listOffset) {
        uint32_t currAlias;
        uint32_t listCount = gMainTable.taggedAliasLists[listOffset];
        /* +1 to skip listCount */
        const uint16_t *currList = gMainTable.taggedAliasLists + listOffset + 1;
        for (currAlias = 0; currAlias < listCount; currAlias++) {
            if (currList[currAlias]
                && ucnv_compareNames(alias, GET_STRING(currList[currAlias]))==0)
            {
                return TRUE;
            }
        }
    }
    return FALSE;
}